

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O1

void __thiscall ODDLParser::Reference::Reference(Reference *this,Reference *ref)

{
  Name **ppNVar1;
  Name *this_00;
  ulong uVar2;
  
  uVar2 = ref->m_numRefs;
  this->m_numRefs = uVar2;
  if (uVar2 != 0) {
    ppNVar1 = (Name **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 << 3);
    this->m_referencedName = ppNVar1;
    if (this->m_numRefs != 0) {
      uVar2 = 0;
      do {
        this_00 = (Name *)operator_new(0x10);
        Name::Name(this_00,ref->m_referencedName[uVar2]);
        this->m_referencedName[uVar2] = this_00;
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->m_numRefs);
    }
  }
  return;
}

Assistant:

Reference::Reference(const Reference &ref) {
    m_numRefs=ref.m_numRefs;
    if(m_numRefs!=0){
        m_referencedName = new Name*[m_numRefs];
        for ( size_t i = 0; i < m_numRefs; i++ ) {
            m_referencedName[i] = new Name(*ref.m_referencedName[i]);
        }
    }
}